

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

SNMPPacket * GenerateTestSNMPRequestPacket(void)

{
  SNMPPacket *pSVar1;
  snmp_request_id_t RequestId;
  deque<VarBind,_std::allocator<VarBind>_> *pdVar2;
  shared_ptr<IntegerType> local_290;
  shared_ptr<BER_CONTAINER> local_280;
  shared_ptr<SortableOIDType> local_270;
  shared_ptr<OIDType> local_260;
  VarBind local_250;
  undefined4 local_21c;
  shared_ptr<IntegerType> local_218;
  shared_ptr<BER_CONTAINER> local_208;
  shared_ptr<SortableOIDType> local_1f8;
  shared_ptr<OIDType> local_1e8;
  VarBind local_1d8;
  undefined4 local_1a4;
  shared_ptr<IntegerType> local_1a0;
  shared_ptr<BER_CONTAINER> local_190;
  shared_ptr<SortableOIDType> local_180;
  shared_ptr<OIDType> local_170;
  VarBind local_160;
  shared_ptr<OctetType> local_130;
  shared_ptr<BER_CONTAINER> local_120;
  shared_ptr<SortableOIDType> local_110;
  shared_ptr<OIDType> local_100;
  VarBind local_f0;
  undefined4 local_bc;
  shared_ptr<IntegerType> local_b8;
  shared_ptr<BER_CONTAINER> local_a8;
  shared_ptr<SortableOIDType> local_98;
  shared_ptr<OIDType> local_88;
  VarBind local_78;
  allocator local_41;
  string local_40 [48];
  SNMPPacket *local_10;
  SNMPPacket *packet;
  
  pSVar1 = (SNMPPacket *)operator_new(0xd8);
  SNMPPacket::SNMPPacket(pSVar1);
  local_10 = pSVar1;
  SNMPPacket::setPDUType(pSVar1,GetRequestPDU);
  pSVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"public",&local_41);
  SNMPPacket::setCommunityString(pSVar1,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pSVar1 = local_10;
  RequestId = random();
  SNMPPacket::setRequestID(pSVar1,RequestId);
  SNMPPacket::setVersion(local_10,SNMP_VERSION_1);
  pdVar2 = &local_10->varbindList;
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_98);
  std::shared_ptr<OIDType>::shared_ptr<SortableOIDType,void>(&local_88,&local_98);
  local_bc = 0x2a;
  std::make_shared<IntegerType,int>((int *)&local_b8);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>(&local_a8,&local_b8);
  VarBind::VarBind(&local_78,(shared_ptr<OIDType> *)&local_88,(shared_ptr<BER_CONTAINER> *)&local_a8
                  );
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::push_back
            ((deque<VarBind,_std::allocator<VarBind>_> *)pdVar2,&local_78);
  VarBind::~VarBind(&local_78);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_a8);
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr(&local_b8);
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_88);
  Catch::clara::std::shared_ptr<SortableOIDType>::~shared_ptr(&local_98);
  pdVar2 = &local_10->varbindList;
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_110);
  std::shared_ptr<OIDType>::shared_ptr<SortableOIDType,void>(&local_100,&local_110);
  std::make_shared<OctetType,char_const(&)[9]>((char (*) [9])&local_130);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>(&local_120,&local_130);
  VarBind::VarBind(&local_f0,(shared_ptr<OIDType> *)&local_100,
                   (shared_ptr<BER_CONTAINER> *)&local_120);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::push_back
            ((deque<VarBind,_std::allocator<VarBind>_> *)pdVar2,&local_f0);
  VarBind::~VarBind(&local_f0);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_120)
  ;
  Catch::clara::std::shared_ptr<OctetType>::~shared_ptr(&local_130);
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_100);
  Catch::clara::std::shared_ptr<SortableOIDType>::~shared_ptr(&local_110);
  pdVar2 = &local_10->varbindList;
  std::make_shared<SortableOIDType,char_const(&)[27]>((char (*) [27])&local_180);
  std::shared_ptr<OIDType>::shared_ptr<SortableOIDType,void>(&local_170,&local_180);
  local_1a4 = 0;
  std::make_shared<IntegerType,int>((int *)&local_1a0);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>(&local_190,&local_1a0);
  VarBind::VarBind(&local_160,(shared_ptr<OIDType> *)&local_170,
                   (shared_ptr<BER_CONTAINER> *)&local_190);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::push_back
            ((deque<VarBind,_std::allocator<VarBind>_> *)pdVar2,&local_160);
  VarBind::~VarBind(&local_160);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_190)
  ;
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr(&local_1a0);
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_170);
  Catch::clara::std::shared_ptr<SortableOIDType>::~shared_ptr(&local_180);
  pdVar2 = &local_10->varbindList;
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_1f8);
  std::shared_ptr<OIDType>::shared_ptr<SortableOIDType,void>(&local_1e8,&local_1f8);
  local_21c = 0xffffffd6;
  std::make_shared<IntegerType,int>((int *)&local_218);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>(&local_208,&local_218);
  VarBind::VarBind(&local_1d8,(shared_ptr<OIDType> *)&local_1e8,
                   (shared_ptr<BER_CONTAINER> *)&local_208);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::push_back
            ((deque<VarBind,_std::allocator<VarBind>_> *)pdVar2,&local_1d8);
  VarBind::~VarBind(&local_1d8);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_208)
  ;
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr(&local_218);
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_1e8);
  Catch::clara::std::shared_ptr<SortableOIDType>::~shared_ptr(&local_1f8);
  pdVar2 = &local_10->varbindList;
  std::make_shared<SortableOIDType,char_const(&)[17]>((char (*) [17])&local_270);
  std::shared_ptr<OIDType>::shared_ptr<SortableOIDType,void>(&local_260,&local_270);
  std::make_shared<IntegerType,int>((int *)&local_290);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>(&local_280,&local_290);
  VarBind::VarBind(&local_250,(shared_ptr<OIDType> *)&local_260,
                   (shared_ptr<BER_CONTAINER> *)&local_280);
  Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::push_back
            ((deque<VarBind,_std::allocator<VarBind>_> *)pdVar2,&local_250);
  VarBind::~VarBind(&local_250);
  Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_280)
  ;
  Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr(&local_290);
  Catch::clara::std::shared_ptr<OIDType>::~shared_ptr((shared_ptr<OIDType> *)&local_260);
  Catch::clara::std::shared_ptr<SortableOIDType>::~shared_ptr(&local_270);
  return local_10;
}

Assistant:

static SNMPPacket* GenerateTestSNMPRequestPacket(){
    SNMPPacket* packet = new SNMPPacket();

    packet->setPDUType(GetRequestPDU);
    packet->setCommunityString("public");
    packet->setRequestID(random());
    packet->setVersion(SNMP_VERSION_1);

    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.1"),                  std::make_shared<IntegerType>(42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.2"),                  std::make_shared<OctetType>("test 123")));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.52420.9999999"),        std::make_shared<IntegerType>(0)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.3"),                  std::make_shared<IntegerType>(-42)));
    packet->varbindList.push_back(VarBind(std::make_shared<SortableOIDType>(".1.3.6.1.4.1.5.4"),                  std::make_shared<IntegerType>(-420000)));

    return packet;
}